

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pam.c
# Opt level: O0

pam_t * pam_create_from_file(char *inpath)

{
  int iVar1;
  FILE *__stream;
  pam_t *__ptr;
  char *pcVar2;
  size_t sVar3;
  uint8_t *puVar4;
  int local_454;
  int idx;
  size_t linelen;
  char *tok1;
  char *tok0;
  char line [1024];
  uint local_2c;
  int linenumber;
  pam_t *pam;
  FILE *infile;
  char *inpath_local;
  
  __stream = fopen(inpath,"r");
  if (__stream == (FILE *)0x0) {
    printf("pam.c: couldn\'t open input file: %s\n",inpath);
  }
  else {
    __ptr = (pam_t *)calloc(1,0x20);
    __ptr->width = -1;
    __ptr->height = -1;
    __ptr->depth = -1;
    __ptr->maxval = -1;
    __ptr->type = -1;
    local_2c = 0;
    while (pcVar2 = fgets((char *)&tok0,0x400,__stream), pcVar2 != (char *)0x0) {
      local_2c = local_2c + 1;
      linelen = 0;
      if ((char)tok0 != '#') {
        sVar3 = strlen((char *)&tok0);
        for (local_454 = 0; (ulong)(long)local_454 < sVar3; local_454 = local_454 + 1) {
          if (line[(long)local_454 + -8] == ' ') {
            line[(long)local_454 + -8] = '\0';
            if (linelen != 0) {
              printf("pam.c: More than two tokens, %s:%d\n",inpath,(ulong)local_2c);
            }
            linelen = (size_t)(line + (long)(local_454 + 1) + -8);
          }
          if (line[(long)local_454 + -8] == '\n') {
            line[(long)local_454 + -8] = '\0';
          }
        }
        iVar1 = strcmp((char *)&tok0,"P7");
        if (iVar1 != 0) {
          iVar1 = strcmp((char *)&tok0,"ENDHDR");
          if (iVar1 == 0) {
            if ((((__ptr->width < 0) || (__ptr->height < 0)) || (__ptr->depth < 0)) ||
               ((__ptr->maxval < 0 || (__ptr->type < 0)))) {
              printf("pam.c: missing required metadata field\n");
            }
            else {
              if (__ptr->maxval != 0xff) {
                __assert_fail("pam->maxval == 255",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/pam.c"
                              ,0x8c,"pam_t *pam_create_from_file(const char *)");
              }
              __ptr->datalen = __ptr->width * __ptr->height * __ptr->depth;
              puVar4 = (uint8_t *)malloc((long)__ptr->datalen);
              __ptr->data = puVar4;
              iVar1 = __ptr->datalen;
              sVar3 = fread(__ptr->data,1,(long)__ptr->datalen,__stream);
              if ((long)iVar1 == sVar3) {
                fclose(__stream);
                return __ptr;
              }
              printf("pam.c: couldn\'t read body\n");
            }
            goto LAB_004f61cb;
          }
          iVar1 = strcmp((char *)&tok0,"WIDTH");
          if ((iVar1 == 0) && (linelen != 0)) {
            iVar1 = atoi((char *)linelen);
            __ptr->width = iVar1;
          }
          else {
            iVar1 = strcmp((char *)&tok0,"HEIGHT");
            if ((iVar1 == 0) && (linelen != 0)) {
              iVar1 = atoi((char *)linelen);
              __ptr->height = iVar1;
            }
            else {
              iVar1 = strcmp((char *)&tok0,"DEPTH");
              if ((iVar1 == 0) && (linelen != 0)) {
                iVar1 = atoi((char *)linelen);
                __ptr->depth = iVar1;
              }
              else {
                iVar1 = strcmp((char *)&tok0,"MAXVAL");
                if ((iVar1 == 0) && (linelen != 0)) {
                  iVar1 = atoi((char *)linelen);
                  __ptr->maxval = iVar1;
                }
                else {
                  iVar1 = strcmp((char *)&tok0,"TUPLTYPE");
                  if ((iVar1 == 0) && (linelen != 0)) {
                    iVar1 = strcmp((char *)linelen,"GRAYSCALE_ALPHA");
                    if (iVar1 == 0) {
                      __ptr->type = 5000;
                    }
                    else {
                      iVar1 = strcmp((char *)linelen,"RGB_ALPHA");
                      if (iVar1 == 0) {
                        __ptr->type = 0x1389;
                      }
                      else {
                        iVar1 = strcmp((char *)linelen,"RGB");
                        if (iVar1 == 0) {
                          __ptr->type = 0x138a;
                        }
                        else {
                          iVar1 = strcmp((char *)linelen,"GRAYSCALE");
                          if (iVar1 == 0) {
                            __ptr->type = 0x138b;
                          }
                          else {
                            printf("pam.c: unrecognized tupl type %s\n",linelen);
                          }
                        }
                      }
                    }
                  }
                  else {
                    printf("pam.c: unrecognized attribute %s\n",&tok0);
                  }
                }
              }
            }
          }
        }
      }
    }
    printf("pam.c: unexpected EOF\n");
LAB_004f61cb:
    free(__ptr);
    fclose(__stream);
  }
  return (pam_t *)0x0;
}

Assistant:

pam_t *pam_create_from_file(const char *inpath)
{
    FILE *infile = fopen(inpath, "r");
    if (infile == NULL) {
        printf("pam.c: couldn't open input file: %s\n", inpath);
        return NULL;
    }

    pam_t *pam = calloc(1, sizeof(pam_t));
    pam->width = -1;
    pam->height = -1;
    pam->depth = -1;
    pam->maxval = -1;
    pam->type = -1;

    int linenumber = 0;

    while (1) {
        char line[1024];
        if (!fgets(line, sizeof(line), infile)) {
            printf("pam.c: unexpected EOF\n");
            goto fail;
        }
        linenumber++;

        char *tok0 = line;
        char *tok1 = NULL;

        if (line[0] == '#') // comment
            continue;

        size_t linelen = strlen(line);
        for (int idx = 0; idx < linelen; idx++) {
            if (line[idx] == ' ') {
                line[idx] = 0;
                if (tok1) {
                    printf("pam.c: More than two tokens, %s:%d\n", inpath, linenumber);
                }

                tok1 = &line[idx+1];
            }
            if (line[idx] == '\n')
                line[idx] = 0;
        }

        if (!strcmp(tok0, "P7"))
            continue;

        if (!strcmp(tok0, "ENDHDR"))
            break;

        if (!strcmp(tok0, "WIDTH") && tok1) {
            pam->width = atoi(tok1);
            continue;
        }

        if (!strcmp(tok0, "HEIGHT") && tok1) {
            pam->height = atoi(tok1);
            continue;
        }

        if (!strcmp(tok0, "DEPTH") && tok1) {
            pam->depth = atoi(tok1);
            continue;
        }

        if (!strcmp(tok0, "MAXVAL") && tok1) {
            pam->maxval = atoi(tok1);
            continue;
        }

        if (!strcmp(tok0, "TUPLTYPE") && tok1) {
            if (!strcmp(tok1, "GRAYSCALE_ALPHA")) {
                pam->type = PAM_GRAYSCALE_ALPHA;
                continue;
            }

            if (!strcmp(tok1, "RGB_ALPHA")) {
                pam->type = PAM_RGB_ALPHA;
                continue;
            }

            if (!strcmp(tok1, "RGB")) {
                pam->type = PAM_RGB;
                continue;
            }

            if (!strcmp(tok1, "GRAYSCALE")) {
                pam->type = PAM_GRAYSCALE;
                continue;
            }

            printf("pam.c: unrecognized tupl type %s\n", tok1);
            continue;
        }

        printf("pam.c: unrecognized attribute %s\n", tok0);
    }

    if (pam->width < 0 || pam->height < 0 || pam->depth < 0 ||
        pam->maxval < 0 || pam->type < 0) {
        printf("pam.c: missing required metadata field\n");
        goto fail;
    }

    assert(pam->maxval == 255);

    pam->datalen = pam->width * pam->height * pam->depth;
    pam->data = malloc(pam->datalen);
    if (pam->datalen != fread(pam->data, 1, pam->datalen, infile)) {
        printf("pam.c: couldn't read body\n");
        goto fail;
    }

    fclose(infile);
    return pam;

  fail:
    free(pam);
    fclose(infile);
    return NULL;
}